

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O3

matd_t * homography_compute2(double (*c) [4])

{
  long lVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  matd_t *pmVar6;
  int row;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  ulong uVar14;
  bool bVar15;
  double local_2b8 [62];
  double local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  double local_a8;
  double dStack_a0;
  undefined8 local_98;
  double local_90;
  double dStack_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  pdVar9 = local_2b8;
  pdVar13 = local_2b8;
  local_2b8[2] = 1.0;
  local_2b8[3] = 0.0;
  local_2b8[4] = 0.0;
  uVar14 = 0;
  local_2b8[5] = 0.0;
  local_2b8[8] = (*c)[2];
  local_2b8[0] = (*c)[0];
  local_2b8[1] = (*c)[1];
  local_2b8[6] = local_2b8[8] * -local_2b8[0];
  local_2b8[7] = local_2b8[8] * -local_2b8[1];
  local_2b8[9] = 0.0;
  local_2b8[10] = 0.0;
  local_2b8[0xb] = 0.0;
  local_2b8[0xc] = local_2b8[0];
  local_2b8[0xd] = local_2b8[1];
  local_2b8[0xe] = 1.0;
  local_2b8[0x11] = (*c)[3];
  local_2b8[0xf] = local_2b8[0x11] * -local_2b8[0];
  local_2b8[0x10] = local_2b8[0x11] * -local_2b8[1];
  local_2b8[0x14] = 1.0;
  local_2b8[0x15] = 0.0;
  local_2b8[0x16] = 0.0;
  local_2b8[0x17] = 0.0;
  local_2b8[0x1a] = c[1][2];
  local_2b8[0x12] = c[1][0];
  local_2b8[0x13] = c[1][1];
  local_2b8[0x18] = local_2b8[0x1a] * -local_2b8[0x12];
  local_2b8[0x19] = local_2b8[0x1a] * -local_2b8[0x13];
  local_2b8[0x1b] = 0.0;
  local_2b8[0x1c] = 0.0;
  local_2b8[0x1d] = 0.0;
  local_2b8[0x1e] = local_2b8[0x12];
  local_2b8[0x1f] = local_2b8[0x13];
  local_2b8[0x20] = 1.0;
  local_2b8[0x23] = c[1][3];
  local_2b8[0x21] = local_2b8[0x23] * -local_2b8[0x12];
  local_2b8[0x22] = local_2b8[0x23] * -local_2b8[0x13];
  local_2b8[0x26] = 1.0;
  local_2b8[0x27] = 0.0;
  local_2b8[0x28] = 0.0;
  local_2b8[0x29] = 0.0;
  local_2b8[0x2c] = c[2][2];
  local_2b8[0x24] = c[2][0];
  local_2b8[0x25] = c[2][1];
  local_2b8[0x2a] = local_2b8[0x2c] * -local_2b8[0x24];
  local_2b8[0x2b] = local_2b8[0x2c] * -local_2b8[0x25];
  local_2b8[0x2d] = 0.0;
  local_2b8[0x2e] = 0.0;
  local_2b8[0x2f] = 0.0;
  local_2b8[0x30] = local_2b8[0x24];
  local_2b8[0x31] = local_2b8[0x25];
  local_2b8[0x32] = 1.0;
  local_2b8[0x35] = c[2][3];
  local_2b8[0x33] = local_2b8[0x35] * -local_2b8[0x24];
  local_2b8[0x34] = local_2b8[0x35] * -local_2b8[0x25];
  local_2b8[0x38] = 1.0;
  local_2b8[0x39] = 0.0;
  local_2b8[0x3a] = 0.0;
  local_2b8[0x3b] = 0.0;
  local_c8 = c[3][2];
  local_2b8[0x36] = c[3][0];
  local_2b8[0x37] = c[3][1];
  local_2b8[0x3c] = local_c8 * -local_2b8[0x36];
  local_2b8[0x3d] = local_c8 * -local_2b8[0x37];
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0;
  local_a8 = local_2b8[0x36];
  dStack_a0 = local_2b8[0x37];
  local_98 = 0x3ff0000000000000;
  local_80 = c[3][3];
  local_90 = local_80 * -local_2b8[0x36];
  dStack_88 = local_80 * -local_2b8[0x37];
  lVar12 = 1;
  pdVar5 = local_2b8;
  do {
    pdVar5 = pdVar5 + 10;
    uVar10 = 0xffffffff;
    dVar2 = 0.0;
    pdVar4 = pdVar9;
    uVar7 = uVar14;
    do {
      if (dVar2 < ABS(*pdVar4)) {
        uVar10 = uVar7 & 0xffffffff;
        dVar2 = ABS(*pdVar4);
      }
      uVar7 = uVar7 + 1;
      pdVar4 = pdVar4 + 9;
    } while (uVar7 != 8);
    if (dVar2 < 1e-10) {
      homography_compute2_cold_1();
    }
    if (uVar14 != uVar10) {
      lVar8 = -9;
      do {
        dVar2 = pdVar9[lVar8 + 9];
        pdVar9[lVar8 + 9] =
             *(double *)((long)pdVar13 + lVar8 * 8 + (long)((int)uVar10 * 9) * 8 + 0x48);
        *(double *)((long)pdVar13 + lVar8 * 8 + (long)((int)uVar10 * 9) * 8 + 0x48) = dVar2;
        lVar8 = lVar8 + 1;
      } while (uVar14 + lVar8 != 0);
    }
    pdVar4 = pdVar5;
    lVar8 = lVar12;
    if (uVar14 < 7) {
      do {
        lVar11 = lVar8 * 9 + uVar14;
        dVar2 = local_2b8[lVar11];
        dVar3 = local_2b8[uVar14 * 10];
        local_2b8[lVar11] = 0.0;
        lVar11 = 1;
        do {
          pdVar4[lVar11 + -1] = pdVar9[lVar11] * (-dVar2 / dVar3) + pdVar4[lVar11 + -1];
          lVar1 = uVar14 + lVar11;
          lVar11 = lVar11 + 1;
        } while (lVar1 != 8);
        lVar8 = lVar8 + 1;
        pdVar4 = pdVar4 + 9;
      } while (lVar8 != 8);
    }
    uVar14 = uVar14 + 1;
    lVar12 = lVar12 + 1;
    pdVar9 = pdVar9 + 10;
    pdVar13 = (double *)((long)pdVar13 + 8);
  } while (uVar14 != 8);
  pdVar5 = &local_38;
  uVar14 = 7;
  pdVar9 = &local_80;
  lVar12 = 0;
  do {
    dVar2 = 0.0;
    if (uVar14 < 7) {
      lVar8 = 0;
      pdVar13 = pdVar5;
      dVar2 = 0.0;
      do {
        dVar2 = dVar2 + pdVar9[lVar8] * *pdVar13;
        lVar8 = lVar8 + 1;
        pdVar13 = pdVar13 + 9;
      } while (lVar12 != lVar8);
    }
    local_2b8[uVar14 * 9 + 8] = (local_2b8[uVar14 * 9 + 8] - dVar2) / local_2b8[uVar14 * 10];
    lVar12 = lVar12 + 1;
    pdVar5 = pdVar5 + -9;
    pdVar9 = pdVar9 + -10;
    bVar15 = uVar14 != 0;
    uVar14 = uVar14 - 1;
  } while (bVar15);
  local_78 = local_2b8[8];
  local_70 = local_2b8[0x11];
  local_68 = local_2b8[0x1a];
  local_60 = local_2b8[0x23];
  local_58 = local_2b8[0x2c];
  local_50 = local_2b8[0x35];
  local_48 = local_c8;
  local_40 = local_80;
  local_38 = 1.0;
  pmVar6 = matd_create_data(3,3,&local_78);
  return pmVar6;
}

Assistant:

matd_t* homography_compute2(double c[4][4]) {
    double A[] =  {
            c[0][0], c[0][1], 1,       0,       0, 0, -c[0][0]*c[0][2], -c[0][1]*c[0][2], c[0][2],
                  0,       0, 0, c[0][0], c[0][1], 1, -c[0][0]*c[0][3], -c[0][1]*c[0][3], c[0][3],
            c[1][0], c[1][1], 1,       0,       0, 0, -c[1][0]*c[1][2], -c[1][1]*c[1][2], c[1][2],
                  0,       0, 0, c[1][0], c[1][1], 1, -c[1][0]*c[1][3], -c[1][1]*c[1][3], c[1][3],
            c[2][0], c[2][1], 1,       0,       0, 0, -c[2][0]*c[2][2], -c[2][1]*c[2][2], c[2][2],
                  0,       0, 0, c[2][0], c[2][1], 1, -c[2][0]*c[2][3], -c[2][1]*c[2][3], c[2][3],
            c[3][0], c[3][1], 1,       0,       0, 0, -c[3][0]*c[3][2], -c[3][1]*c[3][2], c[3][2],
                  0,       0, 0, c[3][0], c[3][1], 1, -c[3][0]*c[3][3], -c[3][1]*c[3][3], c[3][3],
    };

    double epsilon = 1e-10;

    // Eliminate.
    for (int col = 0; col < 8; col++) {
        // Find best row to swap with.
        double max_val = 0;
        int max_val_idx = -1;
        for (int row = col; row < 8; row++) {
            double val = fabs(A[row*9 + col]);
            if (val > max_val) {
                max_val = val;
                max_val_idx = row;
            }
        }

        if (max_val < epsilon) {
            fprintf(stderr, "WRN: Matrix is singular.\n");
        }

        // Swap to get best row.
        if (max_val_idx != col) {
            for (int i = col; i < 9; i++) {
                double tmp = A[col*9 + i];
                A[col*9 + i] = A[max_val_idx*9 + i];
                A[max_val_idx*9 + i] = tmp;
            }
        }

        // Do eliminate.
        for (int i = col + 1; i < 8; i++) {
            double f = A[i*9 + col]/A[col*9 + col];
            A[i*9 + col] = 0;
            for (int j = col + 1; j < 9; j++) {
                A[i*9 + j] -= f*A[col*9 + j];
            }
        }
    }

    // Back solve.
    for (int col = 7; col >=0; col--) {
        double sum = 0;
        for (int i = col + 1; i < 8; i++) {
            sum += A[col*9 + i]*A[i*9 + 8];
        }
        A[col*9 + 8] = (A[col*9 + 8] - sum)/A[col*9 + col];
    }
    return matd_create_data(3, 3, (double[]) { A[8], A[17], A[26], A[35], A[44], A[53], A[62], A[71], 1 });
}